

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  bVar7;
  long lVar8;
  char *__function;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  *pbVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  if ((((ulong)this & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar2 = *(ulong *)this;
    if (uVar2 != *(ulong *)right) {
      __assert_fail("parent() == right->parent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fc,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == right->position()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fd,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                   );
    }
    bVar7 = this[10];
    if ((byte)right[10] < (byte)bVar7) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fe,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                   );
    }
    if (to_move < 1) {
      __assert_fail("to_move >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5ff,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                   );
    }
    if ((uint)(byte)right[10] < (uint)to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x600,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                   );
    }
    if ((uVar2 & 7) == 0) {
      lVar8 = (ulong)(byte)this[8] * 0x20;
      puVar1 = (undefined8 *)(uVar2 + 0x10 + lVar8);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)(uVar2 + 0x20 + lVar8);
      uVar6 = puVar1[1];
      *(undefined8 *)(this + (ulong)(byte)bVar7 * 0x20 + 0x20) = *puVar1;
      *(undefined8 *)(this + (ulong)(byte)bVar7 * 0x20 + 0x20 + 8) = uVar6;
      *(undefined8 *)(this + (ulong)(byte)bVar7 * 0x20 + 0x10) = uVar4;
      *(undefined8 *)(this + (ulong)(byte)bVar7 * 0x20 + 0x10 + 8) = uVar5;
      uninitialized_move_n(right,(ulong)(to_move - 1),0,(ulong)(byte)bVar7 + 1,this,alloc);
      uVar2 = *(ulong *)this;
      if ((uVar2 & 7) == 0) {
        lVar12 = (ulong)(to_move - 1) * 0x20;
        lVar8 = (ulong)(byte)this[8] * 0x20;
        *(undefined8 *)(uVar2 + 0x20 + lVar8) = *(undefined8 *)(right + lVar12 + 0x20);
        uVar4 = *(undefined8 *)(right + lVar12 + 0x10 + 8);
        puVar1 = (undefined8 *)(uVar2 + 0x10 + lVar8);
        *puVar1 = *(undefined8 *)(right + lVar12 + 0x10);
        puVar1[1] = uVar4;
        *(undefined4 *)(uVar2 + 0x28 + lVar8) = *(undefined4 *)(right + lVar12 + 0x28);
        if ((ulong)(uint)to_move != (ulong)(byte)right[10]) {
          pbVar9 = right + 0x10;
          lVar8 = (ulong)(uint)to_move * 0x20;
          lVar12 = (ulong)(byte)right[10] << 5;
          do {
            *(undefined8 *)(pbVar9 + 0x10) = *(undefined8 *)(pbVar9 + lVar8 + 0x10);
            uVar4 = *(undefined8 *)(pbVar9 + lVar8 + 8);
            *(undefined8 *)pbVar9 = *(undefined8 *)(pbVar9 + lVar8);
            *(undefined8 *)(pbVar9 + 8) = uVar4;
            *(undefined4 *)(pbVar9 + 0x18) = *(undefined4 *)(pbVar9 + lVar8 + 0x18);
            pbVar9 = pbVar9 + 0x20;
            lVar12 = lVar12 + -0x20;
          } while (lVar8 != lVar12);
        }
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
             )0x0) {
          iVar11 = 0;
          do {
            bVar7 = this[10];
            iVar10 = iVar11 + 1;
            pbVar9 = child(right,iVar11);
            init_child(this,iVar11 + (uint)(byte)bVar7 + 1,pbVar9);
            iVar11 = iVar10;
          } while (to_move != iVar10);
          if (to_move <= (int)(uint)(byte)right[10]) {
            iVar11 = 0;
            do {
              iVar10 = to_move + iVar11;
              bVar7 = right[0xb];
              if (right[0xb] ==
                  (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                   )0x0) {
                bVar7 = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                         )0x7;
              }
              if ((int)(uint)(byte)bVar7 < iVar10) {
                __assert_fail("i + to_move <= right->max_count()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                              ,0x618,
                              "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                             );
              }
              pbVar9 = child(right,iVar10);
              init_child(right,iVar11,pbVar9);
              mutable_child(right,iVar10);
              bVar3 = iVar11 < (int)((uint)(byte)right[10] - to_move);
              iVar11 = iVar11 + 1;
            } while (bVar3);
          }
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                    )((char)this[10] + (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                     )((char)right[10] - (char)to_move);
        return;
      }
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  value_init(count(), alloc, parent()->slot(position()));

  // 2) Move the (to_move - 1) values from the right node to the left node.
  right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  slot_type::move(alloc, right->slot(to_move - 1), parent()->slot(position()));

  // 4) Shift the values in the right node to their correct position.
  slot_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                  right->slot(0));

  // 5) Destroy the now-empty to_move entries in the right node.
  right->value_destroy_n(right->count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the right to the left node.
    for (int i = 0; i < to_move; ++i) {
      init_child(count() + i + 1, right->child(i));
    }
    for (int i = 0; i <= right->count() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() + to_move);
  right->set_count(right->count() - to_move);
}